

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O1

void drawImage6(Array2D<GZ> *px,int w,int h)

{
  ushort uVar1;
  short sVar2;
  GZ *pGVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  unsigned_short uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int i;
  int iVar14;
  int j;
  int iVar15;
  float fVar16;
  double dVar17;
  float fVar18;
  double a;
  ulong local_a0;
  
  if (0 < h) {
    local_a0 = 0;
    do {
      if (0 < w) {
        uVar12 = 0;
        do {
          lVar13 = px->_sizeY * local_a0;
          pGVar3 = px->_data;
          pGVar3[lVar13 + uVar12].g._h = 0;
          pGVar3[lVar13 + uVar12].z = 0.0;
          iVar14 = 0;
          dVar5 = 0.0;
          do {
            dVar4 = 0.0;
            iVar15 = 0;
            do {
              dVar17 = 0.0;
              dVar6 = 0.0;
              uVar9 = 0;
              do {
                uVar10 = uVar9 + 1;
                if (0xfe < uVar9) break;
                dVar7 = dVar6 * dVar6 - dVar17 * dVar17;
                dVar17 = (dVar6 + dVar6) * dVar17 +
                         (dVar4 * 0.3333333432674408 + (double)(int)local_a0) *
                         ((((double)h * 3.5) / (double)w + -1.3333 + 1.3333) / (double)h) + -1.3333;
                dVar6 = (dVar5 * 0.3333333432674408 + (double)(int)uVar12) * (3.5 / (double)w) +
                        -2.5 + dVar7;
                uVar9 = uVar10;
              } while (dVar7 < 100.0);
              fVar18 = (float)(int)uVar10 * 0.00390625 * 5.0;
              fVar16 = (fVar18 - (float)(int)fVar18) + (fVar18 - (float)(int)fVar18);
              fVar16 = (float)(~-(uint)(fVar16 < 1.0) & (uint)(2.0 - fVar16) |
                              (uint)fVar16 & -(uint)(fVar16 < 1.0)) * 4.0 +
                       *(float *)((long)&half::_toFloat + (ulong)pGVar3[lVar13 + uVar12].g._h * 4);
              if ((fVar16 != 0.0) || (NAN(fVar16))) {
                uVar1 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar16 >> 0x17) * 2);
                if (uVar1 == 0) {
                  uVar11 = half::convert((int)fVar16);
                }
                else {
                  uVar11 = (ulong)((uint)uVar1 +
                                  (((uint)fVar16 & 0x7fffff) + 0xfff +
                                   (uint)(((uint)fVar16 >> 0xd & 1) != 0) >> 0xd));
                }
              }
              else {
                uVar11 = (ulong)((uint)fVar16 >> 0x10);
              }
              pGVar3[lVar13 + uVar12].g._h = (unsigned_short)uVar11;
              pGVar3[lVar13 + uVar12].z = fVar18;
              dVar4 = dVar4 + 1.0;
              iVar15 = iVar15 + 1;
            } while (iVar15 != 3);
            dVar5 = dVar5 + 1.0;
            iVar14 = iVar14 + 1;
          } while (iVar14 != 3);
          fVar16 = *(float *)((long)&half::_toFloat + (uVar11 & 0xffff) * 4) * 0.11111112;
          if ((fVar16 != 0.0) || (NAN(fVar16))) {
            sVar2 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar16 >> 0x17) * 2);
            if (sVar2 == 0) {
              uVar8 = half::convert((int)fVar16);
            }
            else {
              uVar8 = sVar2 + (short)(((uint)fVar16 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar16 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar8 = (unsigned_short)((uint)fVar16 >> 0x10);
          }
          pGVar3[lVar13 + uVar12].g._h = uVar8;
          pGVar3[lVar13 + uVar12].z = pGVar3[lVar13 + uVar12].z * 0.11111112;
          uVar12 = uVar12 + 1;
        } while (uVar12 != (uint)w);
      }
      local_a0 = local_a0 + 1;
    } while (local_a0 != (uint)h);
  }
  return;
}

Assistant:

void
drawImage6 (Array2D<GZ> &px, int w, int h)
{
    mndl (px,
	  w, h,
	  0, w,
	  0, h,
	  3, 3,
	  -2.5, 1.0,
	  -1.3333,
	  1,
	  0, 0);
}